

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderParameterProbZ.cpp
# Opt level: O1

void __thiscall OpenMD::OrderParameterProbZ::writeOrderCount(OrderParameterProbZ *this)

{
  char cVar1;
  ostream *poVar2;
  pointer pdVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  double dVar8;
  ofstream rdfStream;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"OrderProb: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"#Order count probablity ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection: (",0xd);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# Prefered Axis:",0x10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n##Order\tProbOrderCount\n",0x18);
    pdVar3 = (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar3;
    if (lVar4 != 0) {
      uVar5 = lVar4 >> 3;
      uVar6 = 0;
      do {
        auVar7._8_4_ = (int)(uVar5 >> 0x20);
        auVar7._0_8_ = uVar5;
        auVar7._12_4_ = 0x45300000;
        dVar8 = pdVar3[uVar6];
        if (this->totalCount_ != 0) {
          dVar8 = dVar8 / (double)this->totalCount_;
        }
        poVar2 = std::ostream::_M_insert<double>
                           ((2.0 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)))
                            * (double)uVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>(dVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        uVar6 = (ulong)((int)uVar6 + 1);
        pdVar3 = (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = (long)(this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
      } while (uVar6 < uVar5);
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void OrderParameterProbZ::writeOrderCount() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#Order count probablity "
                << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "# Prefered Axis:" << axisLabel_
                << "\n##Order\tProbOrderCount\n";
      for (unsigned int i = 0; i < Count_.size(); ++i) {
        RealType order = i * (2.0 / Count_.size());
        RealType prop;
        if (totalCount_ == 0)
          prop = Count_[i];
        else
          prop = Count_[i] / totalCount_;
        rdfStream << order << "\t" << prop << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "OrderProb: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }